

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_decoder_init(ma_decoder_read_proc onRead,ma_decoder_seek_proc onSeek,void *pUserData,
                         ma_decoder_config *pConfig,ma_decoder *pDecoder)

{
  ma_result mVar1;
  ma_data_source_base *pDataSourceBase;
  ma_decoder *pmVar2;
  ma_decoder_config config_1;
  ma_decoder_config config;
  undefined1 local_140 [144];
  undefined1 local_b0 [80];
  ma_allocation_callbacks local_60 [2];
  
  pmVar2 = pDecoder;
  if (pConfig == (ma_decoder_config *)0x0) {
    memset(local_140,0,0x90);
  }
  else {
    memcpy(local_140,pConfig,0x90);
  }
  memcpy(local_b0,local_140,0x90);
  if (pDecoder == (ma_decoder *)0x0) {
    mVar1 = MA_INVALID_ARGS;
  }
  else {
    memset(&(pDecoder->ds).rangeBegInFrames,0,0x220);
    (pDecoder->ds).vtable = &g_ma_decoder_data_source_vtable;
    (pDecoder->ds).rangeEndInFrames = 0xffffffffffffffff;
    (pDecoder->ds).loopEndInFrames = 0xffffffffffffffff;
    (pDecoder->ds).pCurrent = pDecoder;
    (pDecoder->ds).pNext = (ma_data_source *)0x0;
    (pDecoder->ds).onGetNext = (ma_data_source_get_next_proc)0x0;
    pDecoder->onRead = onRead;
    pDecoder->onSeek = onSeek;
    pDecoder->pUserData = pUserData;
    mVar1 = ma_allocation_callbacks_init_copy(&pDecoder->allocationCallbacks,local_60);
    if (mVar1 == MA_SUCCESS) {
      mVar1 = ma_decoder_init__internal
                        ((ma_decoder_read_proc)onSeek,(ma_decoder_seek_proc)local_b0,pDecoder,
                         pConfig,pmVar2);
    }
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_decoder_init(ma_decoder_read_proc onRead, ma_decoder_seek_proc onSeek, void* pUserData, const ma_decoder_config* pConfig, ma_decoder* pDecoder)
{
    ma_decoder_config config;
    ma_result result;

    config = ma_decoder_config_init_copy(pConfig);

    result = ma_decoder__preinit(onRead, onSeek, NULL, pUserData, &config, pDecoder);
    if (result != MA_SUCCESS) {
        return result;
    }

    return ma_decoder_init__internal(onRead, onSeek, pUserData, &config, pDecoder);
}